

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gnuplot-iostream.h
# Opt level: O2

void gnuplotio::
     deref_and_print<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,int>,gnuplotio::ModeBinfmt>
               (gnuplotio *stream,long *arg)

{
  long lVar1;
  plotting_empty_container *this;
  long lVar2;
  size_t i;
  ulong uVar3;
  long lVar4;
  
  lVar2 = *arg;
  lVar1 = arg[1];
  if (lVar2 != lVar1) {
    lVar4 = 0;
    for (uVar3 = 0; uVar3 < (ulong)(lVar1 - lVar2 >> 4); uVar3 = uVar3 + 1) {
      deref_and_print<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,int>,gnuplotio::ModeBinfmt>
                (stream,lVar2 + lVar4);
      lVar2 = *arg;
      lVar1 = arg[1];
      lVar4 = lVar4 + 0x10;
    }
    return;
  }
  this = (plotting_empty_container *)__cxa_allocate_exception(0x10);
  plotting_empty_container::plotting_empty_container(this);
  __cxa_throw(this,&plotting_empty_container::typeinfo,std::length_error::~length_error);
}

Assistant:

void deref_and_print(std::ostream &stream, const VecOfRange<T> &arg, PrintMode) {
    if(PrintMode::is_binfmt && arg.rvec.empty()) throw plotting_empty_container();
    for(size_t i=0; i<arg.rvec.size(); i++) {
        if(i && PrintMode::is_text) stream << " ";
        deref_and_print(stream, arg.rvec[i], PrintMode());
    }
}